

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

Bal_Man_t * Bal_ManAlloc(Gia_Man_t *pGia,Gia_Man_t *pNew,int nLutSize,int nCutNum,int fVerbose)

{
  int iVar1;
  Bal_Man_t *pBVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Bal_Man_t *p;
  int fVerbose_local;
  int nCutNum_local;
  int nLutSize_local;
  Gia_Man_t *pNew_local;
  Gia_Man_t *pGia_local;
  
  pBVar2 = (Bal_Man_t *)calloc(1,0x38);
  aVar3 = Abc_Clock();
  pBVar2->clkStart = aVar3;
  pBVar2->pGia = pGia;
  pBVar2->pNew = pNew;
  pBVar2->nLutSize = nLutSize;
  pBVar2->nCutNum = nCutNum;
  pBVar2->fVerbose = fVerbose;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntAlloc((iVar1 * 3) / 2);
  pBVar2->vCosts = pVVar4;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar5 = Vec_PtrAlloc((iVar1 * 3) / 2);
  pBVar2->vCutSets = pVVar5;
  pVVar4 = pBVar2->vCosts;
  iVar1 = Gia_ManObjNum(pNew);
  Vec_IntFill(pVVar4,iVar1,0);
  pVVar5 = pBVar2->vCutSets;
  iVar1 = Gia_ManObjNum(pNew);
  Vec_PtrFill(pVVar5,iVar1,(void *)0x0);
  pNew->pData = pBVar2;
  return pBVar2;
}

Assistant:

Bal_Man_t * Bal_ManAlloc( Gia_Man_t * pGia, Gia_Man_t * pNew, int nLutSize, int nCutNum, int fVerbose )
{
    Bal_Man_t * p;
    p = ABC_CALLOC( Bal_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pNew     = pNew;
    p->nLutSize = nLutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->vCosts   = Vec_IntAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    p->vCutSets = Vec_PtrAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    Vec_IntFill( p->vCosts, Gia_ManObjNum(pNew), 0 );
    Vec_PtrFill( p->vCutSets, Gia_ManObjNum(pNew), NULL );
    pNew->pData = p;
    return p;
}